

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if ((globalUtilOptind + 1 == argc) && (argv[globalUtilOptind] != (char *)0x0)) {
      Zyx_TestExact(argv[globalUtilOptind]);
      return 0;
    }
    pcVar3 = "File name is not given on the command line.\n";
    iVar2 = -1;
  }
  else {
    iVar2 = -2;
    Abc_Print(-2,"usage: testexact <file>\n");
    Abc_Print(-2,"\t           tests solution of the exact synthesis problem\n");
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    pcVar3 = "\t<file>   : file name in the specified format\n";
  }
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandTestExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Zyx_TestExact( char * pFileName );
    char * pFileName = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
       case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    if ( pFileName == NULL )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    Zyx_TestExact( pFileName );
    return 0;

usage:
    Abc_Print( -2, "usage: testexact <file>\n" );
    Abc_Print( -2, "\t           tests solution of the exact synthesis problem\n" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<file>   : file name in the specified format\n" );
    return 1;
}